

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

shared_ptr<aeron::Publication> __thiscall
aeron::ClientConductor::findPublication(ClientConductor *this,int64_t registrationId)

{
  char *pcVar1;
  undefined4 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var4;
  int iVar5;
  SourcedException *pSVar6;
  char *pcVar7;
  undefined8 uVar8;
  long *plVar9;
  Publication *__tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  _func_int **pp_Var11;
  pointer in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar12;
  char *pcVar13;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  shared_ptr<aeron::Publication> sVar15;
  allocator local_e1;
  undefined8 local_e0;
  string local_d8;
  UnsafeBufferPosition publicationLimit;
  string local_90;
  string local_70;
  string local_50;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)(registrationId + 8));
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pbVar10 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (registrationId + 0x30);
  pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            (registrationId + 0x38);
  lVar14 = (long)pbVar3 - (long)pbVar10;
  lVar12 = (lVar14 >> 4) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar12) {
    lVar14 = lVar12 + 1;
    __args_1 = pbVar10 + 9;
    do {
      if (__args_1[-8]._M_dataplus._M_p == in_RDX) {
        __args_1 = __args_1 + -9;
        goto LAB_0013f430;
      }
      if ((pointer)__args_1[-4].field_2._M_allocated_capacity == in_RDX) {
        __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &__args_1[-5].field_2;
        goto LAB_0013f430;
      }
      if (__args_1[1]._M_dataplus._M_p == in_RDX) goto LAB_0013f430;
      if ((pointer)__args_1[5].field_2._M_allocated_capacity == in_RDX) {
        __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &__args_1[4].field_2;
        goto LAB_0013f430;
      }
      lVar14 = lVar14 + -1;
      __args_1 = __args_1 + 0x12;
    } while (1 < lVar14);
    lVar14 = (long)pbVar3 - (long)(pbVar10 + lVar12 * 0x12);
    pbVar10 = pbVar10 + lVar12 * 0x12;
  }
  lVar12 = (lVar14 >> 4) * -0x71c71c71c71c71c7;
  if (lVar12 == 1) {
LAB_0013f40a:
    __args_1 = pbVar10;
    if (pbVar10[1]._M_dataplus._M_p != in_RDX) {
      __args_1 = pbVar3;
    }
LAB_0013f430:
    if (__args_1 != pbVar3) {
      std::__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)this,__args_1 + 4);
      if (this->_vptr_ClientConductor == (_func_int **)0x0) {
        iVar5 = (int)__args_1[2]._M_string_length;
        if (iVar5 == 0) {
          if (*(long *)(registrationId + 0x1e8) == 0) {
            std::__throw_bad_function_call();
          }
          lVar12 = (**(code **)(registrationId + 0x1f0))(registrationId + 0x1d8);
          if ((long)(__args_1[2]._M_dataplus._M_p + *(long *)(registrationId + 0x210)) < lVar12) {
            pSVar6 = (SourcedException *)__cxa_allocate_exception(0x48);
            std::__cxx11::to_string(&local_90,*(long *)(registrationId + 0x210));
            std::operator+(&local_d8,"no response from driver in ",&local_90);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
            publicationLimit.m_buffer._vptr_AtomicBuffer = (_func_int **)*plVar9;
            pp_Var11 = (_func_int **)(plVar9 + 2);
            if (publicationLimit.m_buffer._vptr_AtomicBuffer == pp_Var11) {
              publicationLimit.m_buffer._16_8_ = *pp_Var11;
              publicationLimit.m_id = (int32_t)plVar9[3];
              publicationLimit.m_offset = *(int32_t *)((long)plVar9 + 0x1c);
              publicationLimit.m_buffer._vptr_AtomicBuffer =
                   (_func_int **)&publicationLimit.m_buffer.m_length;
            }
            else {
              publicationLimit.m_buffer._16_8_ = *pp_Var11;
            }
            publicationLimit.m_buffer.m_buffer = (uint8_t *)plVar9[1];
            *plVar9 = (long)pp_Var11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,
                       "std::shared_ptr<Publication> aeron::ClientConductor::findPublication(std::int64_t)"
                       ,"");
            pcVar13 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
            ;
            pcVar7 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
            ;
            do {
              pcVar7 = pcVar7 + 1;
              pcVar1 = pcVar13 + 1;
              pcVar13 = pcVar13 + 1;
            } while (*pcVar7 == *pcVar1);
            std::__cxx11::string::string((string *)&local_50,pcVar13 + (*pcVar1 == '/'),&local_e1);
            util::SourcedException::SourcedException
                      (pSVar6,(string *)&publicationLimit,&local_70,&local_50,0x62);
            *(undefined ***)pSVar6 = &PTR__SourcedException_001634e0;
            __cxa_throw(pSVar6,&util::DriverTimeoutException::typeinfo,
                        util::SourcedException::~SourcedException);
          }
        }
        else if (iVar5 == 1) {
          publicationLimit.m_id = *(int *)((long)&__args_1[1].field_2 + 8);
          publicationLimit.m_buffer._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_00163200;
          publicationLimit.m_buffer.m_buffer = *(uint8_t **)(*(long *)(registrationId + 0x110) + 8);
          publicationLimit.m_buffer.m_length =
               *(length_t *)(*(long *)(registrationId + 0x110) + 0x10);
          publicationLimit.m_offset = publicationLimit.m_id << 7;
          local_e0 = &__args_1[1]._M_string_length;
          local_d8._M_dataplus._M_p = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<aeron::Publication,std::allocator<aeron::Publication>,aeron::ClientConductor&,std::__cxx11::string&,long&,long&,int&,int&,aeron::concurrent::status::UnsafeBufferPosition&,int&,std::shared_ptr<aeron::LogBuffers>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length,
                     (Publication **)&local_d8,(allocator<aeron::Publication> *)&local_90,
                     (ClientConductor *)registrationId,__args_1,(long *)(__args_1 + 1),
                     (long *)local_e0,(int *)__args_1[1].field_2._M_local_buf,
                     (int *)(__args_1[1].field_2._M_local_buf + 4),&publicationLimit,
                     (int *)(__args_1[1].field_2._M_local_buf + 0xc),
                     (shared_ptr<aeron::LogBuffers> *)&__args_1[3].field_2);
          plVar9 = (long *)local_d8._M_string_length;
          _Var4._M_p = local_d8._M_dataplus._M_p;
          local_d8._M_dataplus._M_p = (pointer)0x0;
          local_d8._M_string_length = 0;
          this->_vptr_ClientConductor = (_func_int **)_Var4._M_p;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align;
          (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = (long)plVar9;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
            }
            plVar9 = (long *)(this->m_adminLock).super___recursive_mutex_base._M_mutex.__align;
          }
          local_d8._M_dataplus._M_p = (pointer)this->_vptr_ClientConductor;
          if (plVar9 != (long *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)plVar9 + 0xc) = *(int *)((long)plVar9 + 0xc) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)plVar9 + 0xc) = *(int *)((long)plVar9 + 0xc) + 1;
            }
          }
          local_d8._M_string_length = (size_type)plVar9;
          std::__weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)(__args_1 + 4),
                     (__weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)&local_d8);
          if ((long *)local_d8._M_string_length != (long *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              lVar12 = local_d8._M_string_length + 0xc;
              iVar5 = *(int *)lVar12;
              *(int *)lVar12 = *(int *)lVar12 + -1;
              UNLOCK();
            }
            else {
              iVar5 = *(int *)(local_d8._M_string_length + 0xc);
              *(int *)(local_d8._M_string_length + 0xc) = iVar5 + -1;
            }
            if (iVar5 == 1) {
              (**(code **)(*(long *)local_d8._M_string_length + 0x18))();
            }
          }
        }
        else if (iVar5 == 2) {
          pSVar6 = (SourcedException *)__cxa_allocate_exception(0x50);
          uVar2 = *(undefined4 *)((long)&__args_1[2]._M_string_length + 4);
          publicationLimit.m_buffer._vptr_AtomicBuffer =
               (_func_int **)&publicationLimit.m_buffer.m_length;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&publicationLimit,
                     "std::shared_ptr<Publication> aeron::ClientConductor::findPublication(std::int64_t)"
                     ,"");
          pcVar13 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
          ;
          pcVar7 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
          ;
          do {
            pcVar7 = pcVar7 + 1;
            pcVar1 = pcVar13 + 1;
            pcVar13 = pcVar13 + 1;
          } while (*pcVar7 == *pcVar1);
          uVar8 = std::__cxx11::string::string
                            ((string *)&local_d8,pcVar13 + (*pcVar1 == '/'),(allocator *)&local_90);
          local_e0._0_4_ = (undefined4)CONCAT71((int7)((ulong)uVar8 >> 8),1);
          util::SourcedException::SourcedException
                    (pSVar6,(string *)&__args_1[2].field_2,(string *)&publicationLimit,&local_d8,
                     0x73);
          *(undefined ***)pSVar6 = &PTR__SourcedException_001637c8;
          *(undefined4 *)(pSVar6 + 1) = uVar2;
          local_e0 = (size_type *)((ulong)local_e0._4_4_ << 0x20);
          __cxa_throw(pSVar6,&util::RegistrationException::typeinfo,
                      util::SourcedException::~SourcedException);
        }
      }
      goto LAB_0013f540;
    }
  }
  else {
    if (lVar12 == 2) {
LAB_0013f3fd:
      __args_1 = pbVar10;
      if (pbVar10[1]._M_dataplus._M_p != in_RDX) {
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &pbVar10[4].field_2;
        goto LAB_0013f40a;
      }
      goto LAB_0013f430;
    }
    if (lVar12 == 3) {
      __args_1 = pbVar10;
      if (pbVar10[1]._M_dataplus._M_p != in_RDX) {
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &pbVar10[4].field_2;
        goto LAB_0013f3fd;
      }
      goto LAB_0013f430;
    }
  }
  this->_vptr_ClientConductor = (_func_int **)0x0;
  (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = 0;
LAB_0013f540:
  pthread_mutex_unlock((pthread_mutex_t *)(registrationId + 8));
  sVar15.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar15.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Publication>)
         sVar15.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Publication> ClientConductor::findPublication(std::int64_t registrationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_publications.begin(), m_publications.end(),
        [registrationId](const PublicationStateDefn &entry)
        {
            return (registrationId == entry.m_registrationId);
        });

    if (it == m_publications.end())
    {
        return std::shared_ptr<Publication>();
    }

    PublicationStateDefn& state = (*it);
    std::shared_ptr<Publication> pub(state.m_publication.lock());

    if (!pub)
    {
        switch (state.m_status)
        {
            case RegistrationStatus::AWAITING_MEDIA_DRIVER:
                if (m_epochClock() > (state.m_timeOfRegistration + m_driverTimeoutMs))
                {
                    throw DriverTimeoutException(
                        "no response from driver in " + std::to_string(m_driverTimeoutMs) +" ms", SOURCEINFO);
                }
                break;

            case RegistrationStatus::REGISTERED_MEDIA_DRIVER:
            {
                UnsafeBufferPosition publicationLimit(m_counterValuesBuffer, state.m_publicationLimitCounterId);

                pub = std::make_shared<Publication>(
                    *this, state.m_channel, state.m_registrationId, state.m_originalRegistrationId,
                    state.m_streamId, state.m_sessionId, publicationLimit, state.m_channelStatusId, state.m_buffers);

                state.m_publication = std::weak_ptr<Publication>(pub);
                break;
            }

            case RegistrationStatus::ERRORED_MEDIA_DRIVER:
                throw RegistrationException(state.m_errorCode, state.m_errorMessage, SOURCEINFO);
        }
    }

    return pub;
}